

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_degree_with2(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_INT *degree)

{
  int iVar1;
  REF_ADJ_ITEM pRVar2;
  REF_INT *pRVar3;
  ulong uVar4;
  REF_INT RVar5;
  long lVar6;
  
  *degree = 0;
  uVar4 = 0xffffffff;
  if (-1 < node0) {
    uVar4 = 0xffffffff;
    if (node0 < ref_cell->ref_adj->nnode) {
      uVar4 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node0];
    }
  }
  if ((int)uVar4 != -1) {
    RVar5 = ref_cell->ref_adj->item[(int)uVar4].ref;
    pRVar2 = ref_cell->ref_adj->item;
    do {
      if (0 < ref_cell->node_per) {
        pRVar3 = ref_cell->c2n;
        lVar6 = 0;
        do {
          if (pRVar3[(long)ref_cell->size_per * (long)RVar5 + lVar6] == node1) {
            *degree = *degree + 1;
          }
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 < ref_cell->node_per);
      }
      iVar1 = pRVar2[(int)uVar4].next;
      uVar4 = (ulong)iVar1;
      if (uVar4 == 0xffffffffffffffff) {
        RVar5 = -1;
      }
      else {
        RVar5 = pRVar2[uVar4].ref;
      }
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_degree_with2(REF_CELL ref_cell, REF_INT node0,
                                         REF_INT node1, REF_INT *degree) {
  REF_INT item, cell_node, cell;

  *degree = 0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    (*degree)++;
  }

  return REF_SUCCESS;
}